

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

void addCommandDefinition(CommandInfo *comm)

{
  int iVar1;
  _Elt_pointer ppCVar2;
  ulong uVar3;
  _Elt_pointer ppCVar4;
  int iVar5;
  _Elt_pointer ppCVar6;
  ulong uVar7;
  CommandInfo *in_RDI;
  long lVar8;
  _Elt_pointer ppCVar9;
  int local_44;
  CommandInfo *local_40;
  int local_34;
  
  ppCVar2 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  local_40 = in_RDI;
  if (Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur !=
      Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur) {
    lVar8 = CONCAT44(Commands._deque.
                     super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_node._4_4_,
                     (int)Commands._deque.
                          super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node);
    ppCVar6 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppCVar9 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    do {
      iVar1 = local_40->number;
      if (((*ppCVar6)->number == iVar1) && ((*ppCVar6)->isbuiltin == local_40->isbuiltin)) {
        iVar5 = (int)((ulong)((long)Commands._deque.
                                    super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_last -
                             (long)Commands._deque.
                                   super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
                (int)((ulong)((long)Commands._deque.
                                    super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                             (long)Commands._deque.
                                   super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
                ((((uint)((int)Commands._deque.
                               super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_node -
                         (int)Commands._deque.
                              super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (uint)(Commands._deque.
                       super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x40;
        local_44 = iVar1;
        if (iVar5 <= iVar1) {
          local_34 = iVar5;
          error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                         ,&local_44,&local_34);
        }
        uVar3 = ((long)Commands._deque.
                       super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur -
                 (long)Commands._deque.
                       super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                       super__Deque_impl_data._M_start._M_first >> 3) + (long)local_44;
        if (uVar3 < 0x40) {
          ppCVar4 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur + local_44;
        }
        else {
          uVar7 = (uVar3 >> 6) + 0xfc00000000000000;
          if (0 < (long)uVar3) {
            uVar7 = uVar3 >> 6;
          }
          ppCVar4 = (_Elt_pointer)
                    ((uVar3 + uVar7 * -0x40) * 8 +
                    *(long *)(CONCAT44(Commands._deque.
                                       super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node._4_4_,
                                       (int)Commands._deque.
                                            super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_node) +
                             uVar7 * 8));
        }
        error<String,String>
                  ("Attempted to redefine command #%1 (%2) as %3",&(*ppCVar4)->name,&local_40->name)
        ;
      }
      ppCVar6 = ppCVar6 + 1;
      if (ppCVar6 == ppCVar9) {
        ppCVar6 = *(_Elt_pointer *)(lVar8 + 8);
        lVar8 = lVar8 + 8;
        ppCVar9 = ppCVar6 + 0x40;
      }
    } while (ppCVar6 != ppCVar2);
  }
  if (Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<CommandInfo*,std::allocator<CommandInfo*>>::_M_push_back_aux<CommandInfo*const&>
              ((deque<CommandInfo*,std::allocator<CommandInfo*>> *)&Commands,&local_40);
  }
  else {
    *Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
     super__Deque_impl_data._M_finish._M_cur = local_40;
    Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur =
         Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur + 1;
  }
  return;
}

Assistant:

void addCommandDefinition (CommandInfo* comm)
{
	// Ensure that there is no conflicts
	for (CommandInfo* it : Commands)
	{
		if (it->number == comm->number && it->isbuiltin == comm->isbuiltin)
		{
			error ("Attempted to redefine command #%1 (%2) as %3",
				   Commands[comm->number]->name, comm->name);
		}
	}

	Commands << comm;
}